

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

int cmdParseScript(char *script,cmdScript_t *s,int diags)

{
  int iVar1;
  cmdInstr_t *pcVar2;
  uintptr_t *puVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uintptr_t unaff_R12;
  ulong unaff_R13;
  int iVar10;
  long lVar11;
  bool bVar12;
  cmdCtlParse_t ctl;
  uintptr_t p [10];
  cmdTagStep_t tag_step [50];
  char v [65536];
  cmdCtlParse_t cStack_10254;
  uint uStack_1024c;
  undefined4 uStack_10248;
  undefined4 uStack_10244;
  int iStack_10240;
  undefined4 uStack_1023c;
  char *pcStack_10238;
  size_t sStack_10228;
  char *pcStack_10220;
  uintptr_t uStack_10218;
  ulong uStack_10210;
  undefined4 uStack_10208;
  undefined4 uStack_10204;
  int iStack_10200;
  undefined4 uStack_101fc;
  char *pcStack_101f8;
  uint auStack_101c8 [100];
  char acStack_10038 [65544];
  
  cStack_10254.eaten = 0;
  pcStack_10220 = script;
  sVar5 = strlen(script);
  iVar10 = (int)sVar5;
  piVar6 = (int *)calloc(1,(long)((int)((long)iVar10 * 0x30 + 0x60U >> 1) + iVar10 + 0x280));
  s->par = piVar6;
  if (piVar6 == (int *)0x0) {
    iVar9 = -1;
  }
  else {
    s->var = piVar6 + 10;
    s->instr = (cmdInstr_t *)(piVar6 + 0xa0);
    s->str_area = (char *)(piVar6 + (long)((iVar10 + 2) / 2) * 0xc + 0xa0);
    s->str_area_len = iVar10;
    uVar7 = 0;
    s->str_area_pos = 0;
    s->instrs = 0;
    iVar9 = 0;
    if (cStack_10254.eaten < iVar10) {
      iVar10 = 0;
      iVar9 = 0;
      uVar7 = 0;
      sStack_10228 = sVar5;
      do {
        iVar4 = cmdParse(pcStack_10220,&uStack_10218,0x10000,acStack_10038,&cStack_10254);
        iVar1 = iStack_10200;
        if (iVar4 == -1) {
          iVar4 = -1;
        }
        else if (cmdInfo[intCmdIdx].cvis == 0) {
          iVar4 = -4;
        }
        if (iVar4 < 0) {
          if (diags != 0) {
            cmdParseScript_cold_1();
          }
          bVar12 = iVar9 == 0;
          iVar9 = iVar10;
          if (bVar12) {
            iVar9 = -0x37;
            iVar10 = iVar9;
          }
        }
        else {
          sVar5 = CONCAT44(uStack_101fc,iStack_10200);
          if (sVar5 != 0) {
            memcpy(s->str_area + s->str_area_pos,acStack_10038,sVar5);
            s->str_area[(long)s->str_area_pos + sVar5] = '\0';
            pcStack_101f8 = s->str_area + s->str_area_pos;
            s->str_area_pos = s->str_area_pos + iVar1 + 1;
          }
          unaff_R13 = uStack_10210;
          uStack_10248 = uStack_10208;
          uStack_10244 = uStack_10204;
          iStack_10240 = iStack_10200;
          uStack_1023c = uStack_101fc;
          pcStack_10238 = pcStack_101f8;
          unaff_R12 = uStack_10218;
          if (uStack_10218 == 0x331) {
            if ((int)uVar7 < 0x32) {
              uStack_1024c = uVar7;
              if (0 < (int)uVar7) {
                uVar8 = 0;
                do {
                  if (unaff_R13 == auStack_101c8[uVar8 * 2]) {
                    if (diags != 0) {
                      fprintf(_stderr,"Duplicate tag: %ld\n",unaff_R13);
                    }
                    if (iVar9 == 0) {
                      iVar9 = -0x35;
                    }
                    iVar4 = -1;
                    iVar10 = iVar9;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar7 != uVar8);
              }
              auStack_101c8[(long)(int)uStack_1024c * 2] = (uint)unaff_R13;
              auStack_101c8[(long)(int)uStack_1024c * 2 + 1] = s->instrs;
              uVar7 = uStack_1024c + 1;
              unaff_R12 = 0x331;
            }
            else {
              if (diags != 0) {
                fprintf(_stderr,"Too many tags: %ld\n",uStack_10210);
              }
              if (iVar9 == 0) {
                iVar10 = -0x36;
              }
              unaff_R12 = 0x331;
              iVar4 = -1;
              iVar9 = iVar10;
            }
          }
        }
        if (unaff_R12 != 0x331 && -1 < iVar4) {
          pcVar2 = s->instr;
          iVar1 = s->instrs;
          s->instrs = iVar1 + 1;
          pcVar2[iVar1].p[0] = unaff_R12;
          pcVar2[iVar1].p[1] = unaff_R13;
          pcVar2[iVar1].p[2] = CONCAT44(uStack_10244,uStack_10248);
          (pcVar2[iVar1].p + 2)[1] = CONCAT44(uStack_1023c,iStack_10240);
          pcVar2[iVar1].p[4] = (uintptr_t)pcStack_10238;
          *&pcVar2[iVar1].opt = cStack_10254.opt;
        }
      } while (cStack_10254.eaten < (int)sStack_10228);
    }
    if (0 < s->instrs) {
      lVar11 = 0;
      do {
        pcVar2 = s->instr;
        pcStack_10238 = (char *)pcVar2[lVar11].p[4];
        puVar3 = pcVar2[lVar11].p;
        uStack_10248 = (undefined4)puVar3[2];
        uStack_10244 = *(undefined4 *)((long)puVar3 + 0x14);
        iStack_10240 = (int)(puVar3 + 2)[1];
        uStack_1023c = *(undefined4 *)((long)puVar3 + 0x1c);
        if ((pcVar2[lVar11].p[0] - 0x32c < 5) || (pcVar2[lVar11].p[0] == 0x322)) {
          if (0 < (int)uVar7) {
            uVar8 = 0;
            do {
              if (pcVar2[lVar11].p[1] == (ulong)auStack_101c8[uVar8 * 2]) {
                pcVar2[lVar11].p[1] = (long)(int)auStack_101c8[uVar8 * 2 + 1];
                goto LAB_00108db2;
              }
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
          if (diags != 0) {
            fprintf(_stderr,"Can\'t resolve tag %ld\n");
          }
          if (iVar9 == 0) {
            iVar9 = -0x3f;
          }
        }
LAB_00108db2:
        lVar11 = lVar11 + 1;
      } while (lVar11 < s->instrs);
    }
  }
  return iVar9;
}

Assistant:

int cmdParseScript(char *script, cmdScript_t *s, int diags)
{
   int idx, len, b, i, j, tags, resolved;
   int status;
   uintptr_t p[10];
   cmdInstr_t instr;
   cmdCtlParse_t ctl;
   char v[CMD_MAX_EXTENSION];

   ctl.eaten = 0;

   status = 0;

   cmdTagStep_t tag_step[PI_MAX_SCRIPT_TAGS];

   len = strlen(script);

   /* calloc space for PARAMS, VARS, CMDS, and STRINGS */

   b = (sizeof(int) * (PI_MAX_SCRIPT_PARAMS + PI_MAX_SCRIPT_VARS)) +
       (sizeof(cmdInstr_t) * (len + 2) / 2) + len;

   s->par = calloc(1, b);

   if (s->par == NULL) return -1;

   s->var = s->par + PI_MAX_SCRIPT_PARAMS;

   s->instr = (cmdInstr_t *)(s->var + PI_MAX_SCRIPT_VARS);

   s->str_area = (char *)(s->instr + ((len + 2) / 2));

   s->str_area_len = len;
   s->str_area_pos = 0;

   s->instrs = 0;

   tags = 0;

   idx = 0;

   while (ctl.eaten<len)
   {
      idx = cmdParse(script, p, CMD_MAX_EXTENSION, v, &ctl);

      /* abort if command is illegal in a script */

      if ((idx >= 0) || (idx != CMD_UNKNOWN_CMD))
      {
         if (!cmdInfo[intCmdIdx].cvis) idx = CMD_NOT_IN_SCRIPT;
      }

      if (idx >= 0)
      {
         if (p[3])
         {
            memcpy(s->str_area + s->str_area_pos, v, p[3]);
            s->str_area[s->str_area_pos + p[3]] = 0;
            p[4] = (intptr_t) s->str_area + s->str_area_pos;
            s->str_area_pos += (p[3] + 1);
         }

         memcpy(&instr.p, p, sizeof(instr.p));

         if (instr.p[0] == PI_CMD_TAG)
         {
            if (tags < PI_MAX_SCRIPT_TAGS)
            {
               /* check tag not already used */
               for (j=0; j<tags; j++)
               {
                  if (tag_step[j].tag == instr.p[1])
                  {
                     if (diags)
                     {
                        fprintf(stderr, "Duplicate tag: %"PRIdPTR"\n", instr.p[1]);
                     }

                     if (!status) status = PI_DUP_TAG;
                     idx = -1;
                  }
               }

               tag_step[tags].tag = instr.p[1];
               tag_step[tags].step = s->instrs;
               tags++;
            }
            else
            {
               if (diags)
               {
                  fprintf(stderr, "Too many tags: %"PRIdPTR"\n", instr.p[1]);
               }
               if (!status) status = PI_TOO_MANY_TAGS;
               idx = -1;
            }
         }
      }
      else
      {
         if (diags)
         {
            if (idx == CMD_UNKNOWN_CMD)
               fprintf(stderr, "Unknown command: %s\n", cmdStr());
            else if (idx == CMD_NOT_IN_SCRIPT)
               fprintf(stderr, "Command illegal in script: %s\n", cmdStr());
            else
               fprintf(stderr, "Bad parameter to %s\n", cmdStr());
         }
         if (!status) status = PI_BAD_SCRIPT_CMD;
      }

      if (idx >= 0)
      {
         if (instr.p[0] != PI_CMD_TAG)
         {
            memcpy(instr.opt, &ctl.opt, sizeof(instr.opt));
            s->instr[s->instrs++] = instr;
         }
      }
   }

   for (i=0; i<s->instrs; i++)
   {
      instr = s->instr[i];

      /* resolve jumps */

      if ((instr.p[0] == PI_CMD_JMP) || (instr.p[0] == PI_CMD_CALL) ||
          (instr.p[0] == PI_CMD_JZ)  || (instr.p[0] == PI_CMD_JNZ)  ||
          (instr.p[0] == PI_CMD_JM)  || (instr.p[0] == PI_CMD_JP))
      {
         resolved = 0;

         for (j=0; j<tags; j++)
         {
            if (instr.p[1] == tag_step[j].tag)
            {
               s->instr[i].p[1] = tag_step[j].step;
               resolved = 1;
               break;
            }
         }

         if (!resolved)
         {
            if (diags)
            {
               fprintf(stderr, "Can't resolve tag %"PRIdPTR"\n", instr.p[1]);
            }
            if (!status) status = PI_BAD_TAG;
         }
      }
   }
   return status;
}